

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

ProcessorInstance * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,ProcessorInstance *i)

{
  replaceExpression(this,&i->targetProcessor);
  replaceExpression(this,&i->specialisationArgs);
  if ((i->clockMultiplierRatio).object != (Expression *)0x0) {
    replaceExpression(this,&i->clockMultiplierRatio);
  }
  if ((i->clockDividerRatio).object != (Expression *)0x0) {
    replaceExpression(this,&i->clockDividerRatio);
  }
  return i;
}

Assistant:

virtual AST::ProcessorInstance& visit (AST::ProcessorInstance& i)
    {
        replaceExpression (i.targetProcessor);
        replaceExpression (i.specialisationArgs);

        if (i.clockMultiplierRatio != nullptr)
            replaceExpression (i.clockMultiplierRatio);

        if (i.clockDividerRatio != nullptr)
            replaceExpression (i.clockDividerRatio);

        return i;
    }